

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<FunctionDef>::relocate
          (QArrayDataPointer<FunctionDef> *this,qsizetype offset,FunctionDef **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<FunctionDef> *in_RDI;
  FunctionDef **unaff_retaddr;
  FunctionDef *res;
  FunctionDef *first;
  QArrayDataPointer<FunctionDef> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<FunctionDef,long_long>
            (first,(longlong)in_RDI,(FunctionDef *)0x128037);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<FunctionDef>,FunctionDef_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0xd0 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }